

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O0

CollectAllAwaiter<std::vector<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>,_std::allocator<async_simple::Try<void>_>,_false>
* __thiscall
async_simple::coro::detail::LazyPromiseBase::
await_transform<async_simple::coro::detail::SimpleCollectAllAwaitable<std::vector<async_simple::coro::Lazy<void>,std::allocator<async_simple::coro::Lazy<void>>>,std::allocator<async_simple::Try<void>>,false>>
          (LazyPromiseBase *this,
          SimpleCollectAllAwaitable<std::vector<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>,_std::allocator<async_simple::Try<void>_>,_false>
          *awaitable)

{
  CollectAllAwaiter<std::vector<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>,_std::allocator<async_simple::Try<void>_>,_false>
  *in_RDI;
  SimpleCollectAllAwaitable<std::vector<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>,_std::allocator<async_simple::Try<void>_>,_false>
  *in_stack_00000040;
  Executor *in_stack_00000048;
  
  coAwait<async_simple::coro::detail::SimpleCollectAllAwaitable<std::vector<async_simple::coro::Lazy<void>,std::allocator<async_simple::coro::Lazy<void>>>,std::allocator<async_simple::Try<void>>,false>>
            (in_stack_00000048,in_stack_00000040);
  return in_RDI;
}

Assistant:

auto await_transform(Awaitable&& awaitable) {
        // See CoAwait.h for details.
        return detail::coAwait(_executor, std::forward<Awaitable>(awaitable));
    }